

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMRegressor.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::GLMRegressor_DoubleArray::ByteSizeLong(GLMRegressor_DoubleArray *this)

{
  bool bVar1;
  uint uVar2;
  int size;
  long lVar3;
  int cached_size;
  size_t data_size;
  uint count;
  uint32_t cached_has_bits;
  size_t total_size;
  GLMRegressor_DoubleArray *this_local;
  
  _count = 0;
  uVar2 = _internal_value_size(this);
  lVar3 = (ulong)uVar2 * 8;
  if ((ulong)uVar2 != 0) {
    _count = google::protobuf::internal::WireFormatLite::Int32Size((int32_t)lVar3);
    _count = _count + 1;
  }
  _count = lVar3 + _count;
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar3 = std::__cxx11::string::size();
    _count = lVar3 + _count;
  }
  size = google::protobuf::internal::ToCachedSize(_count);
  SetCachedSize(this,size);
  return _count;
}

Assistant:

size_t GLMRegressor_DoubleArray::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.GLMRegressor.DoubleArray)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated double value = 1;
  {
    unsigned int count = static_cast<unsigned int>(this->_internal_value_size());
    size_t data_size = 8UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
            static_cast<int32_t>(data_size));
    }
    total_size += data_size;
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}